

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

ostringstream * toml::detail::format_filename(ostringstream *oss,source_location *loc)

{
  void *pvVar1;
  ostream *poVar2;
  string *psVar3;
  source_location *in_RSI;
  ostringstream *in_RDI;
  
  pvVar1 = (void *)std::ostream::operator<<(in_RDI,color::ansi::bold);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar1,color::ansi::blue);
  poVar2 = std::operator<<(poVar2," --> ");
  pvVar1 = (void *)std::ostream::operator<<(poVar2,color::ansi::reset);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar1,color::ansi::bold);
  psVar3 = source_location::file_name_abi_cxx11_(in_RSI);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,'\n');
  std::ostream::operator<<(poVar2,color::ansi::reset);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::ostringstream&
format_filename(std::ostringstream& oss, const source_location& loc)
{
    // --> example.toml
    oss << color::bold << color::blue << " --> " << color::reset
        << color::bold << loc.file_name() << '\n' << color::reset;
    return oss;
}